

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void VP8LBitsEntropyUnrefined(uint32_t *array,int n,VP8LBitEntropy *entropy)

{
  uint64_t uVar1;
  VP8LBitEntropy *in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  uint32_t v;
  
  VP8LBitEntropyInit(in_RDX);
  for (v = 0; (int)v < in_ESI; v = v + 1) {
    if (*(int *)(in_RDI + (long)(int)v * 4) != 0) {
      in_RDX->sum = *(int *)(in_RDI + (long)(int)v * 4) + in_RDX->sum;
      in_RDX->nonzero_code = v;
      in_RDX->nonzeros = in_RDX->nonzeros + 1;
      uVar1 = VP8LFastSLog2(v);
      in_RDX->entropy = uVar1 + in_RDX->entropy;
      if (in_RDX->max_val < *(uint *)(in_RDI + (long)(int)v * 4)) {
        in_RDX->max_val = *(uint32_t *)(in_RDI + (long)(int)v * 4);
      }
    }
  }
  uVar1 = VP8LFastSLog2(v);
  in_RDX->entropy = uVar1 - in_RDX->entropy;
  return;
}

Assistant:

void VP8LBitsEntropyUnrefined(const uint32_t* WEBP_RESTRICT const array, int n,
                              VP8LBitEntropy* WEBP_RESTRICT const entropy) {
  int i;

  VP8LBitEntropyInit(entropy);

  for (i = 0; i < n; ++i) {
    if (array[i] != 0) {
      entropy->sum += array[i];
      entropy->nonzero_code = i;
      ++entropy->nonzeros;
      entropy->entropy += VP8LFastSLog2(array[i]);
      if (entropy->max_val < array[i]) {
        entropy->max_val = array[i];
      }
    }
  }
  entropy->entropy = VP8LFastSLog2(entropy->sum) - entropy->entropy;
}